

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symul.cpp
# Opt level: O1

vector<particle,_std::allocator<particle>_> * __thiscall symul::moveParticles(symul *this)

{
  vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>> *pvVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  iterator iVar4;
  pointer ppVar5;
  vec2<float> vVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  symul *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *p_Var10;
  pointer ppVar11;
  int iVar12;
  pair<int,_int> *i_1;
  long lVar13;
  long lVar14;
  element_type *peVar15;
  pointer ppVar16;
  pointer ppVar17;
  vector<particle,_std::allocator<particle>_> *__range1;
  long lVar18;
  particle *i_2;
  vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_> *i;
  pointer this_00;
  ulong uVar19;
  bool bVar20;
  float fVar21;
  vec2f vVar22;
  int thrn;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> collisions;
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  futures;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bcoll;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  splited;
  int local_cc;
  __state_type local_c8;
  long local_b8;
  float local_a4;
  symul *local_a0;
  undefined1 local_98 [8];
  int local_90;
  long *local_80;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_78;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  local_60;
  __basic_future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_48;
  long local_38;
  
  local_cc = 0xf;
  ppVar11 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppVar3 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  ::vector(&local_60,0xf,(allocator_type *)local_98);
  for (this_00 = local_60.
                 super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      local_60.
      super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::reserve
              (this_00,(ulong)((long)(this->particles).
                                     super__Vector_base<particle,_std::allocator<particle>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)(this->particles).
                                     super__Vector_base<particle,_std::allocator<particle>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) / (ulong)(long)local_cc
              );
  }
  ppVar17 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar17) {
    local_a4 = (float)(int)((ulong)((long)ppVar11 - (long)ppVar3 >> 4) / 0xf);
    lVar13 = 4;
    uVar19 = 0;
    do {
      fVar21 = floorf(*(float *)((long)&(ppVar17->position).x + lVar13) / local_a4);
      iVar12 = local_cc + -1;
      if ((int)fVar21 < local_cc) {
        iVar12 = (int)fVar21;
      }
      pvVar1 = (vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>> *)
               (local_60.
                super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar12);
      local_98 = *(undefined1 (*) [8])((long)ppVar17 + lVar13 + -4);
      local_90 = (int)uVar19;
      iVar4._M_current = *(pair<vec2<float>,_int> **)(pvVar1 + 8);
      if (iVar4._M_current == *(pair<vec2<float>,_int> **)(pvVar1 + 0x10)) {
        std::vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>>::
        _M_realloc_insert<std::pair<vec2<float>,int>>
                  (pvVar1,iVar4,(pair<vec2<float>,_int> *)local_98);
      }
      else {
        (iVar4._M_current)->second = local_90;
        (iVar4._M_current)->first = (vec2<float>)local_98;
        *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0xc;
      }
      uVar19 = uVar19 + 1;
      ppVar17 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x10;
    } while (uVar19 < (ulong)((long)(this->particles).
                                    super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppVar17 >> 4));
  }
  local_a0 = this;
  if (0 < local_cc) {
    lVar14 = 1;
    lVar13 = 0;
    do {
      local_38 = lVar13 + 1;
      if (local_38 < local_cc) {
        local_a4 = local_a0->particleR + local_a0->particleR +
                   local_60.
                   super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar13].
                   super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].first.y;
        lVar18 = lVar14;
        do {
          ppVar5 = local_60.
                   super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18].
                   super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar16 = local_60.
                         super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].
                         super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar5;
              ppVar16 = ppVar16 + 1) {
            local_98 = *(undefined1 (*) [8])&ppVar16->first;
            local_90 = ppVar16->second;
            if (local_a4 < (float)local_98._4_4_) break;
            pvVar1 = (vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>>
                      *)(local_60.
                         super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar13);
            iVar4._M_current = *(pair<vec2<float>,_int> **)(pvVar1 + 8);
            if (iVar4._M_current == *(pair<vec2<float>,_int> **)(pvVar1 + 0x10)) {
              std::vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>>::
              _M_realloc_insert<std::pair<vec2<float>,int>const&>
                        (pvVar1,iVar4,(pair<vec2<float>,_int> *)local_98);
            }
            else {
              vVar6 = ppVar16->first;
              (iVar4._M_current)->second = ppVar16->second;
              (iVar4._M_current)->first = vVar6;
              *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0xc;
            }
          }
          lVar18 = lVar18 + 1;
        } while ((int)lVar18 < local_cc);
      }
      lVar14 = lVar14 + 1;
      lVar13 = local_38;
    } while (local_38 < local_cc);
  }
  std::
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::vector((vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
            *)local_98,(long)local_cc,(allocator_type *)&local_c8);
  if (0 < local_cc) {
    lVar14 = 8;
    lVar13 = 0;
    do {
      local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016cfd8;
      peVar15 = (element_type *)(p_Var9 + 1);
      p_Var9[2]._M_use_count = 0;
      p_Var9[1]._M_use_count = 0;
      p_Var9[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var9[1]._M_weak_count + 1) = 0;
      p_Var9[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var9[3]._M_use_count = 0;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0016d028;
      p_Var10 = (_Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *
                )operator_new(0x30);
      std::__future_base::
      _Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::_Result
                (p_Var10);
      p_Var9[4]._vptr__Sp_counted_base = (_func_int **)p_Var10;
      p_Var9[4]._M_use_count = (_Atomic_word)lVar13;
      p_Var9[5]._vptr__Sp_counted_base = (_func_int **)local_a0;
      *(int **)&p_Var9[5]._M_use_count = &local_cc;
      p_Var9[6]._vptr__Sp_counted_base = (_func_int **)&local_60;
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_80 = (long *)operator_new(0x20);
      *local_80 = (long)&PTR___State_0016d080;
      local_80[1] = (long)peVar15;
      local_80[2] = (long)std::__future_base::
                          _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/src/symul.cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          ::_M_run;
      local_80[3] = 0;
      std::thread::_M_start_thread(&local_78,&local_80,0);
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      _Var7._M_pi = local_c8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (p_Var9[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var9[3]._vptr__Sp_counted_base =
           (_func_int **)
           local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      bVar20 = local_c8.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar15;
      local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var9;
      if (bVar20) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
      }
      if (local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
        p_Var9->_M_use_count = 1;
        p_Var9->_M_weak_count = 1;
        p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016d0c0;
        p_Var9[2]._M_use_count = 0;
        p_Var9[1]._M_use_count = 0;
        p_Var9[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var9[1]._M_weak_count + 1) = 0;
        p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_0016d110;
        p_Var10 = (_Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   *)operator_new(0x30);
        std::__future_base::
        _Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::_Result
                  (p_Var10);
        _Var7._M_pi = local_c8.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        p_Var9[3]._vptr__Sp_counted_base = (_func_int **)p_Var10;
        p_Var9[3]._M_use_count = (_Atomic_word)lVar13;
        p_Var9[4]._vptr__Sp_counted_base = (_func_int **)local_a0;
        *(int **)&p_Var9[4]._M_use_count = &local_cc;
        p_Var9[5]._vptr__Sp_counted_base = (_func_int **)&local_60;
        bVar20 = local_c8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(p_Var9 + 1);
        local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var9;
        if (bVar20) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
        }
      }
      std::__basic_future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::__basic_future(&local_48,&local_c8);
      if (local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      _Var7._M_pi = local_48._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar15 = local_48._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      local_48._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_48._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_98 + lVar14);
      puVar2 = (undefined8 *)((long)local_98 + -8 + lVar14);
      *puVar2 = peVar15;
      puVar2[1] = _Var7._M_pi;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      if (local_48._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x10;
    } while (lVar13 < local_cc);
  }
  psVar8 = local_a0;
  local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8 = 0;
  if (0 < local_cc) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::get
                (&local_78,
                 (future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *
                 )((long)local_98 + lVar13));
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_c8,
                 local_c8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,
                 local_78.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_78.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      if (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar14 < local_cc);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )local_c8.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       )local_c8.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi,&psVar8->mt_rand);
  _Var7._M_pi = local_c8.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  for (peVar15 = local_c8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr; peVar15 != (element_type *)_Var7._M_pi;
      peVar15 = (element_type *)&peVar15->_M_result) {
    ppVar11 = (psVar8->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
              super__Vector_impl_data._M_start;
    particle::collideWith
              (ppVar11 + *(int *)&peVar15->_vptr__State_baseV2,
               ppVar11 + *(int *)((long)&peVar15->_vptr__State_baseV2 + 4));
  }
  ppVar11 = (psVar8->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVar3 = (psVar8->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ppVar11 != ppVar3) {
    do {
      particle::collideBox(ppVar11,&psVar8->box,&psVar8->particleR);
      ppVar11 = ppVar11 + 1;
    } while (ppVar11 != ppVar3);
  }
  ppVar11 = (psVar8->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVar3 = (psVar8->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ppVar11 != ppVar3) {
    fVar21 = psVar8->timeTick;
    do {
      vVar22.x = (ppVar11->velocity).x * fVar21 + (ppVar11->position).x;
      vVar22.y = (ppVar11->velocity).y * fVar21 + (ppVar11->position).y;
      ppVar11->position = vVar22;
      ppVar11 = ppVar11 + 1;
    } while (ppVar11 != ppVar3);
  }
  if (local_c8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    operator_delete(local_c8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,local_b8 -
                            (long)local_c8.
                                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
  }
  std::
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::~vector((vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             *)local_98);
  std::
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  ::~vector(&local_60);
  return &psVar8->particles;
}

Assistant:

const std::vector<particle>& symul::moveParticles()
{
    using posind = std::vector<std::pair<vec2f, int>>; 

    // number of threads == number of buckets
    int thrn = 15;

    // put positions in thrn buckets by their Y
    int buckLen = particles.size() / thrn;
    std::vector<posind> splited(thrn);
    for(auto& i : splited)
        i.reserve(particles.size() * 2 / thrn);
    for(int i = 0; i < particles.size(); i++)
    {
        int mybucket = static_cast<int>(std::floor(particles[i].getPosition().getY() / buckLen));
        if(mybucket >= thrn)
            mybucket = thrn - 1;
        splited[mybucket].push_back(std::make_pair(particles[i].getPosition(), i));
    }
    // put particles close to bucket edge in multiple buckets
    for(int b = 0; b < thrn; b++)
    {
        float myend = splited[b].back().first.getY() + particleR * 2;
        for(int other = b + 1; other < thrn; other++)
        {
            for(auto p : splited[other])
            {
                if(p.first.getY() > myend)
                    break;
                splited[b].push_back(p);
            }
        }
    }

    // function that returns collisions from one bucket
    auto getCollisions = [&](int b)
    {
        std::vector<std::pair<int, int>> myCollisions;    
        myCollisions.reserve(particles.size() * 2 / thrn);

        std::sort(splited[b].begin(), splited[b].end(), [](auto x, auto y)
        { 
            return x.first.getX() < y.first.getX();
        });

        auto startj = splited[b].begin();
        for(auto i = splited[b].begin(); i < splited[b].end(); i++)
        {
            while(startj < i && startj->first.getX() < i->first.getX() - particleR * 2)
                startj++;
            for(auto j = startj; j < i; j++)
            {
                if((j->first - i->first).getLength() < 2 * particleR)
                    myCollisions.push_back(std::make_pair(i->second, j->second));
            }
        }
        return myCollisions;
    };

    // get collisions
    std::vector<std::future<std::vector<std::pair<int, int>>>> futures(thrn);
    for(int i = 0; i < thrn; i++)
    {
        futures[i] = std::async(std::launch::async, getCollisions, i);
    }

    // get collisions in one vector
    std::vector<std::pair<int, int>> collisions;
    for(int i = 0; i < thrn; i++)
    {
        auto bcoll = futures[i].get();
        collisions.insert(collisions.end(), bcoll.begin(), bcoll.end());
    }

    // shuffle collisions
    std::shuffle(collisions.begin(), collisions.end(), mt_rand);

    // apply collisions
    for(auto& i : collisions)
        particles[i.first].collideWith(particles[i.second]);
    
    // collide with box
    for(auto& i : particles)
        i.collideBox(box, particleR);

    // update position
    for(auto& p : particles)
        p.update(timeTick);

    //std::cerr << "collisions: " << collisions.size() << std::endl;

    return particles;
}